

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clnt_generic.c
# Opt level: O2

xprt_stat clnt_req_process_reply(SVCXPRT *xprt,svc_req *req)

{
  ushort *puVar1;
  ushort uVar2;
  XDR *pXVar3;
  undefined8 uVar4;
  char cVar5;
  ushort uVar6;
  xprt_stat xVar7;
  opr_rbtree_node *poVar8;
  ushort *puVar9;
  bool bVar10;
  clnt_req cc_k;
  opr_rbtree_node local_2d8 [21];
  u_int32_t local_34;
  
  pXVar3 = req->rq_xdrs;
  rpc_dplx_rlt((rpc_dplx_rec *)xprt,"clnt_req_process_reply",0x234);
  local_34 = (req->rq_msg).rm_xid;
  poVar8 = opr_rbtree_lookup((opr_rbtree *)(xprt[1].xp_remote.ss.__ss_padding + 0x66),local_2d8);
  rpc_dplx_rut((rpc_dplx_rec *)xprt,"clnt_req_process_reply",0x237);
  if (poVar8 == (opr_rbtree_node *)0x0) {
    if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)
                ("%s: %p fd %d lookup failed xid %u","clnt_req_process_reply",xprt,
                 (ulong)(uint)xprt->xp_fd,(ulong)local_34);
    }
  }
  else {
    puVar9 = (ushort *)((long)&poVar8[0x15].right + 4);
    LOCK();
    puVar1 = (ushort *)((long)&poVar8[0x15].right + 4);
    uVar6 = *puVar1;
    *puVar1 = *puVar1 & 0xfffe;
    UNLOCK();
    if ((uVar6 & 1) != 0) {
      svc_rqst_expire_remove((clnt_req *)&poVar8[-2].parent);
      poVar8[0x14].red = 0;
    }
    uVar6 = *puVar9;
    do {
      LOCK();
      uVar2 = *puVar9;
      bVar10 = uVar6 == uVar2;
      if (bVar10) {
        *puVar9 = uVar6 | 8;
        uVar2 = uVar6;
      }
      uVar6 = uVar2;
      UNLOCK();
    } while (!bVar10);
    if ((uVar6 & 0xc) == 0) {
      _seterr_reply((rpc_msg *)&req->rq_msg,(rpc_err *)(poVar8 + 0x14));
      if (*(int *)&poVar8[0x14].right == 0) {
        cVar5 = (*(code *)(poVar8[0x11].parent)->left->parent)(poVar8[0x11].parent,&poVar8[4].red);
        if (cVar5 == '\0') {
          *(undefined4 *)&poVar8[0x14].right = 7;
          *(undefined4 *)&poVar8[0x14].left = 6;
        }
        else if (((poVar8[0x12].parent != (opr_rbtree_node *)0x0) &&
                 (uVar4._0_4_ = poVar8[0x12].red, uVar4._4_4_ = poVar8[0x12].gen,
                 cVar5 = (*(code *)(poVar8[0x11].parent)->left[1].parent)
                                   (poVar8[0x11].parent,pXVar3,poVar8[0x12].parent,uVar4),
                 cVar5 == '\0')) && (*(int *)&poVar8[0x14].right == 0)) {
          *(undefined4 *)&poVar8[0x14].right = 2;
        }
        poVar8[0x14].gen = 0;
      }
      if ((__ntirpc_pkg_params.debug_flags._1_1_ & 0x40) != 0) {
        (*__ntirpc_pkg_params.warnx_)
                  ("%s: %p fd %d xid %u result=%d","clnt_req_process_reply",xprt,
                   (ulong)(uint)xprt->xp_fd,(ulong)*(uint *)((long)&poVar8[0x15].left + 4),
                   (ulong)*(uint *)&poVar8[0x14].right);
      }
      (*(code *)poVar8[0x13].left)(&poVar8[-2].parent);
    }
    else {
      if ((__ntirpc_pkg_params.debug_flags._1_1_ & 0x40) != 0) {
        (*__ntirpc_pkg_params.warnx_)
                  ("%s: %p fd %d xid %u ignored=%d","clnt_req_process_reply",xprt,
                   (ulong)(uint)xprt->xp_fd,(ulong)*(uint *)((long)&poVar8[0x15].left + 4),
                   (ulong)*(uint *)&poVar8[0x14].right);
      }
      poVar8[0x14].gen = 0;
    }
  }
  xVar7 = (*xprt->xp_ops->xp_stat)(xprt);
  return xVar7;
}

Assistant:

enum xprt_stat
clnt_req_process_reply(SVCXPRT *xprt, struct svc_req *req)
{
	XDR *xdrs = req->rq_xdrs;
	struct rpc_dplx_rec *rec = REC_XPRT(xprt);
	struct opr_rbtree_node *nv;
	struct clnt_req *cc;
	struct clnt_req cc_k;

	rpc_dplx_rli(rec);
	cc_k.cc_xid = req->rq_msg.rm_xid;
	nv = opr_rbtree_lookup(&rec->call_replies, &cc_k.cc_dplx);
	rpc_dplx_rui(rec);
	if (!nv) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s: %p fd %d lookup failed xid %" PRIu32,
			__func__, &rec->xprt, rec->xprt.xp_fd, cc_k.cc_xid);
		return SVC_STAT(xprt);
	}
	cc = opr_containerof(nv, struct clnt_req, cc_dplx);

	/* order dependent */
	if (atomic_postclear_uint16_t_bits(&cc->cc_flags,
					   CLNT_REQ_FLAG_EXPIRING)
	    & CLNT_REQ_FLAG_EXPIRING) {
		svc_rqst_expire_remove(cc);
		cc->cc_expire_ms = 0;	/* atomic barrier(s) */
	}

	if (atomic_postset_uint16_t_bits(&cc->cc_flags, CLNT_REQ_FLAG_ACKSYNC)
	    & (CLNT_REQ_FLAG_ACKSYNC | CLNT_REQ_FLAG_BACKSYNC)) {
		__warnx(TIRPC_DEBUG_FLAG_CLNT_REQ,
			"%s: %p fd %d xid %" PRIu32 " ignored=%d",
			__func__, xprt, xprt->xp_fd, cc->cc_xid,
			cc->cc_error.re_status);
		cc->cc_refreshes = 0;
		return SVC_STAT(xprt);
	}

	_seterr_reply(&req->rq_msg, &(cc->cc_error));
	if (cc->cc_error.re_status == RPC_SUCCESS) {
		if (!AUTH_VALIDATE(cc->cc_auth, &(cc->cc_verf))) {
			cc->cc_error.re_status = RPC_AUTHERROR;
			cc->cc_error.re_why = AUTH_INVALIDRESP;
		} else if (cc->cc_reply.proc
			   && !AUTH_UNWRAP(cc->cc_auth, xdrs,
					   cc->cc_reply.proc,
					   cc->cc_reply.where)) {
			if (cc->cc_error.re_status == RPC_SUCCESS)
				cc->cc_error.re_status = RPC_CANTDECODERES;
		}
		cc->cc_refreshes = 0;
	}

	__warnx(TIRPC_DEBUG_FLAG_CLNT_REQ,
		"%s: %p fd %d xid %" PRIu32 " result=%d",
		__func__, xprt, xprt->xp_fd, cc->cc_xid,
		cc->cc_error.re_status);

	(*cc->cc_process_cb)(cc);
	return SVC_STAT(xprt);
}